

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O2

int __thiscall
particleSamples::read_in_particle_samples_SMASH_binary
          (particleSamples *this,ifstream *SMASH_inputfile,
          vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
          *resulting_particle_list)

{
  size_t i;
  ulong uVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  char block_type;
  int local_144;
  int32_t pdg;
  uint32_t n_part_lines;
  ulong local_138;
  char empty;
  uint32_t ev;
  particleSamples *local_120;
  double time_last_coll;
  double pz;
  double py;
  double px;
  double p0;
  double m;
  double z;
  double y;
  int32_t pdg_mother2;
  int32_t pdg_mother1;
  int32_t proc_type_origin;
  int32_t proc_id_origin;
  int32_t ncoll;
  int32_t charge;
  int32_t id;
  double xsecfac;
  double form_time;
  double impact_parameter;
  double local_a0;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double dStack_68;
  double local_60;
  double local_58;
  
  clear_out_previous_record(this,resulting_particle_list);
  local_138 = 0;
  local_144 = 0;
  local_120 = this;
  while (((int)local_138 < this->event_buffer_size &&
         (std::istream::read((char *)SMASH_inputfile,(long)&block_type),
         ((byte)SMASH_inputfile[*(long *)(*(long *)SMASH_inputfile + -0x18) + 0x20] & 5) == 0))) {
    if (block_type == 'p') {
      impact_parameter = (double)operator_new(0x18);
      *(undefined8 *)impact_parameter = 0;
      *(undefined8 *)((long)impact_parameter + 8) = 0;
      *(undefined8 *)((long)impact_parameter + 0x10) = 0;
      std::
      vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
      ::emplace_back<std::vector<particle_info,std::allocator<particle_info>>*>
                ((vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
                  *)resulting_particle_list,
                 (vector<particle_info,_std::allocator<particle_info>_> **)&impact_parameter);
      std::istream::read((char *)SMASH_inputfile,(long)&n_part_lines);
      lVar2 = (long)local_144;
      for (uVar1 = 0; uVar1 < n_part_lines; uVar1 = uVar1 + 1) {
        std::istream::read((char *)SMASH_inputfile,(long)&ev);
        std::istream::read((char *)SMASH_inputfile,(long)&empty);
        std::istream::read((char *)SMASH_inputfile,(long)&y);
        std::istream::read((char *)SMASH_inputfile,(long)&z);
        std::istream::read((char *)SMASH_inputfile,(long)&m);
        std::istream::read((char *)SMASH_inputfile,(long)&p0);
        std::istream::read((char *)SMASH_inputfile,(long)&px);
        std::istream::read((char *)SMASH_inputfile,(long)&py);
        std::istream::read((char *)SMASH_inputfile,(long)&pz);
        std::istream::read((char *)SMASH_inputfile,(long)&pdg);
        std::istream::read((char *)SMASH_inputfile,(long)&id);
        std::istream::read((char *)SMASH_inputfile,(long)&charge);
        std::istream::read((char *)SMASH_inputfile,(long)&ncoll);
        std::istream::read((char *)SMASH_inputfile,(long)&form_time);
        std::istream::read((char *)SMASH_inputfile,(long)&xsecfac);
        std::istream::read((char *)SMASH_inputfile,(long)&proc_id_origin);
        std::istream::read((char *)SMASH_inputfile,(long)&proc_type_origin);
        std::istream::read((char *)SMASH_inputfile,(long)&time_last_coll);
        std::istream::read((char *)SMASH_inputfile,(long)&pdg_mother1);
        std::istream::read((char *)SMASH_inputfile,(long)&pdg_mother2);
        dVar5 = _ev - time_last_coll;
        local_60 = z - (pz / p0) * dVar5;
        impact_parameter = (double)CONCAT44(impact_parameter._4_4_,pdg);
        local_a0 = m;
        local_58 = time_last_coll;
        auVar3._8_8_ = py;
        auVar3._0_8_ = px;
        auVar4._8_8_ = p0;
        auVar4._0_8_ = p0;
        auVar4 = divpd(auVar3,auVar4);
        local_70 = _empty - dVar5 * auVar4._0_8_;
        dStack_68 = y - dVar5 * auVar4._8_8_;
        local_78 = p0;
        local_90 = px;
        local_88 = py;
        local_80 = pz;
        std::vector<particle_info,_std::allocator<particle_info>_>::push_back
                  ((resulting_particle_list->
                   super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                   )._M_impl.super__Vector_impl_data._M_start[lVar2],(value_type *)&impact_parameter
                  );
      }
      local_138 = (ulong)(n_part_lines + (int)local_138);
      local_144 = local_144 + 1;
      this = local_120;
    }
    else {
      if (block_type != 'f') {
        return 0;
      }
      std::istream::read((char *)SMASH_inputfile,(long)&ev);
      std::istream::read((char *)SMASH_inputfile,(long)&impact_parameter);
      if (6 < this->smash_format_version_) {
        std::istream::read((char *)SMASH_inputfile,(long)&empty);
      }
    }
  }
  return 0;
}

Assistant:

int particleSamples::read_in_particle_samples_SMASH_binary(
    std::ifstream &SMASH_inputfile,
    std::vector<std::vector<particle_info> *> *resulting_particle_list) {
    // clean out the previous record
    clear_out_previous_record(resulting_particle_list);
    int ievent = 0, num_particles = 0;
    while (num_particles < event_buffer_size) {
        char block_type;
        SMASH_inputfile.read(&block_type, sizeof(char));
        if (!SMASH_inputfile) {
            break;
        }
        if (block_type == 'f') {
            uint32_t ev;
            double impact_parameter;
            char empty;
            SMASH_inputfile.read(
                reinterpret_cast<char *>(&ev), sizeof(std::uint32_t));
            SMASH_inputfile.read(
                reinterpret_cast<char *>(&impact_parameter), sizeof(double));
            if (smash_format_version_ > 6) {
                SMASH_inputfile.read(&empty, sizeof(char));
            }
            continue;
        }
        if (block_type != 'p') {
            break;
        }
        resulting_particle_list->push_back(new vector<particle_info>);

        uint32_t n_part_lines;
        SMASH_inputfile.read(
            reinterpret_cast<char *>(&n_part_lines), sizeof(std::uint32_t));
        for (size_t i = 0; i < n_part_lines; i++) {
            double t, x, y, z, m, p0, px, py, pz, form_time, xsecfac,
                time_last_coll;
            int32_t pdg, id, charge, ncoll, proc_id_origin, proc_type_origin,
                pdg_mother1, pdg_mother2;
            SMASH_inputfile.read(reinterpret_cast<char *>(&t), sizeof(double));
            SMASH_inputfile.read(reinterpret_cast<char *>(&x), sizeof(double));
            SMASH_inputfile.read(reinterpret_cast<char *>(&y), sizeof(double));
            SMASH_inputfile.read(reinterpret_cast<char *>(&z), sizeof(double));
            SMASH_inputfile.read(reinterpret_cast<char *>(&m), sizeof(double));
            SMASH_inputfile.read(reinterpret_cast<char *>(&p0), sizeof(double));
            SMASH_inputfile.read(reinterpret_cast<char *>(&px), sizeof(double));
            SMASH_inputfile.read(reinterpret_cast<char *>(&py), sizeof(double));
            SMASH_inputfile.read(reinterpret_cast<char *>(&pz), sizeof(double));
            SMASH_inputfile.read(
                reinterpret_cast<char *>(&pdg), sizeof(std::int32_t));
            SMASH_inputfile.read(
                reinterpret_cast<char *>(&id), sizeof(std::int32_t));
            SMASH_inputfile.read(
                reinterpret_cast<char *>(&charge), sizeof(std::int32_t));
            SMASH_inputfile.read(
                reinterpret_cast<char *>(&ncoll), sizeof(std::int32_t));
            SMASH_inputfile.read(
                reinterpret_cast<char *>(&form_time), sizeof(double));
            SMASH_inputfile.read(
                reinterpret_cast<char *>(&xsecfac), sizeof(double));
            SMASH_inputfile.read(
                reinterpret_cast<char *>(&proc_id_origin),
                sizeof(std::int32_t));
            SMASH_inputfile.read(
                reinterpret_cast<char *>(&proc_type_origin),
                sizeof(std::int32_t));
            SMASH_inputfile.read(
                reinterpret_cast<char *>(&time_last_coll), sizeof(double));
            SMASH_inputfile.read(
                reinterpret_cast<char *>(&pdg_mother1), sizeof(std::int32_t));
            SMASH_inputfile.read(
                reinterpret_cast<char *>(&pdg_mother2), sizeof(std::int32_t));

            double origin_t = time_last_coll;
            double vx = px / p0, vy = py / p0, vz = pz / p0;
            double dt = t - origin_t;
            double origin_x = x - vx * dt, origin_y = y - vy * dt,
                   origin_z = z - vz * dt;

            particle_info temp_particle_info;
            temp_particle_info.monval = pdg;
            temp_particle_info.mass = m;
            temp_particle_info.t = origin_t;
            temp_particle_info.x = origin_x;
            temp_particle_info.y = origin_y;
            temp_particle_info.z = origin_z;
            temp_particle_info.E = p0;
            temp_particle_info.px = px;
            temp_particle_info.py = py;
            temp_particle_info.pz = pz;

            (*resulting_particle_list)[ievent]->push_back(temp_particle_info);
        }
        num_particles += n_part_lines;
        // std::cout << "Read in " << n_part_lines << " particles" << std::endl;
        ievent++;
    }
    return 0;
}